

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  FancyInteger f;
  Integer k;
  Integer A;
  Integer z;
  Integer j;
  Integer i;
  
  A.value = 5;
  j.value = 3;
  z.value = 100;
  i.value = A.value;
  Integer::operator=(&A,&j);
  Integer::print(&z);
  Integer::print(&i);
  k.value = i.value + j.value;
  i.value = 1000;
  Integer::print(&k);
  poVar1 = std::operator<<((ostream *)&std::cout,"i=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i.value);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"j=");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,j.value);
  std::endl<char,std::char_traits<char>>(poVar1);
  f.super_Integer.value = (Integer)1;
  FancyInteger::print_fancy(&f);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    auto F = 3.14f;

//    auto a = 555i; // Integer(555) // possible with user defined literals

//    Integer i(5);
    auto i = Integer(5);

//    Integer j(3);
    auto j = Integer(3);

//    Integer z('Z');
    auto z = Integer('Z');

    //Integer A(i); // this is copy construction
    auto A = Integer(i);
    // ...
    // ...
    A = j; // copy assignment

    z.print();
    i.print(); //OOP style

//    Integer k = operator+(i, j);
//    Integer k = i + j;
    auto k = i + j;
    k.print();
    std::cout << "i=" << i.value << std::endl;
    std::cout << "j=" << j.value << std::endl;

//    FancyInteger f(1);
    auto f = FancyInteger(1);
    f.print_fancy();

//    operator<<(std::cout, "Hello");
//    std::cout << "Hello";

    return 0;
}